

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O0

void VP8LInitBitReader(VP8LBitReader *br,uint8_t *start,size_t length)

{
  vp8l_val_t value;
  size_t i;
  size_t length_local;
  uint8_t *start_local;
  VP8LBitReader *br_local;
  
  value = 0;
  br->len = length;
  br->val = 0;
  br->bit_pos = 0;
  br->eos = 0;
  length_local = length;
  if (8 < length) {
    length_local = 8;
  }
  for (i = 0; i < length_local; i = i + 1) {
    value = (ulong)start[i] << ((byte)(i << 3) & 0x3f) | value;
  }
  br->val = value;
  br->pos = length_local;
  br->buf = start;
  return;
}

Assistant:

void VP8LInitBitReader(VP8LBitReader* const br, const uint8_t* const start,
                       size_t length) {
  size_t i;
  vp8l_val_t value = 0;
  assert(br != NULL);
  assert(start != NULL);
  assert(length < 0xfffffff8u);   // can't happen with a RIFF chunk.

  br->len = length;
  br->val = 0;
  br->bit_pos = 0;
  br->eos = 0;

  if (length > sizeof(br->val)) {
    length = sizeof(br->val);
  }
  for (i = 0; i < length; ++i) {
    value |= (vp8l_val_t)start[i] << (8 * i);
  }
  br->val = value;
  br->pos = length;
  br->buf = start;
}